

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparse.cpp
# Opt level: O0

lines * __thiscall
spartsi::
split_to_lines_and_transform<spartsi::unparse_attribute_value(std::__cxx11::string_const&)::__0>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,spartsi *this,algorithm *val)

{
  string *Input;
  bool bVar1;
  reference line_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  iterator __end2;
  iterator __begin2;
  lines *__range2;
  is_any_ofF<char> local_48;
  undefined1 local_29;
  algorithm *local_28;
  string *splitters_local;
  string *val_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  lines *result;
  
  local_29 = 0;
  local_28 = val;
  splitters_local = (string *)this;
  local_10 = __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  Input = splitters_local;
  boost::algorithm::is_any_of<std::__cxx11::string>(&local_48,local_28,Set);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const,boost::algorithm::detail::is_any_ofF<char>>
            (__return_storage_ptr__,Input,&local_48,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_48);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(__return_storage_ptr__);
  line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&line), bVar1) {
    line_00 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2);
    unparse_attribute_value::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&val_local + 7),line_00);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

lines split_to_lines_and_transform(std::string const &val, std::string const &splitters, F f) {
        lines result;
        boost::split(result, val, boost::is_any_of(splitters));
        for(auto &line: result) {
            f(line);
        }
        return result;
    }